

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exorCubes.c
# Opt level: O3

int AllocateCover(int nCubes,int nWordsIn,int nWordsOut)

{
  int iVar1;
  cube *pcVar2;
  Cube **ppCVar3;
  Cube *pCVar4;
  long lVar5;
  ulong uVar6;
  Cube *pCVar7;
  int iVar8;
  int iVar9;
  
  ppCVar3 = (Cube **)malloc((long)nCubes << 3);
  iVar9 = 0;
  if (ppCVar3 != (Cube **)0x0) {
    iVar1 = (nWordsOut + nWordsIn) * 4 + 0x28;
    iVar8 = iVar1 * nCubes;
    pCVar4 = (Cube *)calloc(1,(long)iVar8);
    *ppCVar3 = pCVar4;
    iVar9 = 0;
    if (pCVar4 != (Cube *)0x0) {
      pCVar4->pCubeDataIn = (drow *)(pCVar4 + 1);
      pCVar4->pCubeDataOut = (drow *)(&pCVar4[1].fMark + (nWordsIn << 2));
      if (1 < nCubes) {
        lVar5 = (long)iVar1;
        uVar6 = 1;
        do {
          pCVar4 = ppCVar3[uVar6 - 1];
          ppCVar3[uVar6] = (Cube *)(&pCVar4->fMark + lVar5);
          *(byte **)((long)&pCVar4->pCubeDataIn + lVar5) = &pCVar4[1].fMark + lVar5;
          *(byte **)((long)&pCVar4->pCubeDataOut + lVar5) =
               &((Cube *)(&pCVar4->fMark + lVar5))[1].fMark + (nWordsIn << 2);
          uVar6 = uVar6 + 1;
        } while ((uint)nCubes != uVar6);
        pCVar4 = *ppCVar3;
        if (1 < nCubes) {
          uVar6 = 0;
          pCVar7 = pCVar4;
          do {
            pcVar2 = ppCVar3[uVar6 + 1];
            uVar6 = uVar6 + 1;
            pCVar7->Next = pcVar2;
            pCVar7 = pcVar2;
          } while (nCubes - 1 != uVar6);
        }
      }
      g_CoverInfo.nCubesInUse = 0;
      g_CoverInfo.nCubesFree = nCubes;
      s_CubesFree = pCVar4;
      s_pCoverMemory = ppCVar3;
      if (g_CoverInfo.nCubesAlloc != nCubes) {
        __assert_fail("g_CoverInfo.nCubesInUse + g_CoverInfo.nCubesFree == g_CoverInfo.nCubesAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/exor/exorCubes.c"
                      ,0x8e,"int AllocateCover(int, int, int)");
      }
      iVar9 = iVar8 + (int)((long)nCubes << 3);
    }
  }
  return iVar9;
}

Assistant:

int AllocateCover( int nCubes, int nWordsIn, int nWordsOut )
// uses the cover parameters nCubes and nWords
// to allocate-and-clean the cover in one large piece
{
    int OneCubeSize;
    int OneInputSetSize;
    Cube ** pp;
    int TotalSize;
    int i, k;

    // determine the size of one cube WITH storage for bits
    OneCubeSize = sizeof(Cube) + (nWordsIn+nWordsOut)*sizeof(unsigned);
    // determine what is the amount of storage for the input part of the cube 
    OneInputSetSize = nWordsIn*sizeof(unsigned);

    // allocate memory for the array of pointers
    pp = (Cube **)ABC_ALLOC( Cube *, nCubes );
    if ( pp == NULL )
        return 0;

    // determine the size of the total cube cover
    TotalSize = nCubes*OneCubeSize;
    // allocate and clear memory for the cover in one large piece
    pp[0] = (Cube *)ABC_ALLOC( char, TotalSize );
    if ( pp[0] == NULL )
        return 0;
    memset( pp[0], 0, (size_t)TotalSize );

    // assign pointers to cubes and bit strings inside this piece
    pp[0]->pCubeDataIn  = (unsigned*)(pp[0] + 1);
    pp[0]->pCubeDataOut = (unsigned*)((char*)pp[0]->pCubeDataIn + OneInputSetSize);
    for ( i = 1; i < nCubes; i++ )
    {
        pp[i] = (Cube *)((char*)pp[i-1] + OneCubeSize);
        pp[i]->pCubeDataIn = (unsigned*)(pp[i] + 1);
        pp[i]->pCubeDataOut = (unsigned*)((char*)pp[i]->pCubeDataIn + OneInputSetSize);
    }

    // connect the cubes into the list using Next pointers
    for ( k = 0; k < nCubes-1; k++ )
        pp[k]->Next = pp[k+1];
    // the last pointer is already set to NULL

    // assign the head of the free list
    s_CubesFree = pp[0];
    // set the counters of the used and free cubes
    g_CoverInfo.nCubesInUse = 0;
    g_CoverInfo.nCubesFree = nCubes;

    // save the pointer to the allocated memory
    s_pCoverMemory = pp;

    assert ( g_CoverInfo.nCubesInUse + g_CoverInfo.nCubesFree == g_CoverInfo.nCubesAlloc );

    return nCubes*sizeof(Cube *) + TotalSize;
}